

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O2

SnapshotImpl * __thiscall
leveldb::SnapshotList::New(SnapshotList *this,SequenceNumber sequence_number)

{
  SnapshotImpl *pSVar1;
  SnapshotImpl *pSVar2;
  
  if ((this->head_).next_ != &this->head_) {
    pSVar1 = newest(this);
    if (sequence_number < pSVar1->sequence_number_) {
      __assert_fail("empty() || newest()->sequence_number_ <= sequence_number",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/snapshot.h"
                    ,0x3a,"SnapshotImpl *leveldb::SnapshotList::New(SequenceNumber)");
    }
  }
  pSVar2 = (SnapshotImpl *)operator_new(0x28);
  (pSVar2->super_Snapshot)._vptr_Snapshot = (_func_int **)&PTR__Snapshot_0016b6e8;
  pSVar2->sequence_number_ = sequence_number;
  pSVar2->list_ = this;
  pSVar2->next_ = &this->head_;
  pSVar1 = (this->head_).prev_;
  pSVar2->prev_ = pSVar1;
  pSVar1->next_ = pSVar2;
  (this->head_).prev_ = pSVar2;
  return pSVar2;
}

Assistant:

SnapshotImpl* New(SequenceNumber sequence_number) {
    assert(empty() || newest()->sequence_number_ <= sequence_number);

    SnapshotImpl* snapshot = new SnapshotImpl(sequence_number);

#if !defined(NDEBUG)
    snapshot->list_ = this;
#endif  // !defined(NDEBUG)
    snapshot->next_ = &head_;
    snapshot->prev_ = head_.prev_;
    snapshot->prev_->next_ = snapshot;
    snapshot->next_->prev_ = snapshot;
    return snapshot;
  }